

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O3

float64 set_best_quest(dtree_node_t *node,float32 ****mixw,float32 ****means,float32 ****vars,
                      uint32 *veclen,uint32 n_model,uint32 n_state,uint32 n_stream,uint32 n_density,
                      float32 *stwt,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 **dfeat,
                      uint32 n_dfeat,float32 mwfloor)

{
  float32 *pfVar1;
  float32 *pfVar2;
  float32 ***dist;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong d1;
  ulong d2;
  ulong d3;
  float64 fVar6;
  float fVar7;
  double dVar8;
  float32 fVar9;
  
  d1 = (ulong)n_state;
  d3 = (ulong)n_density;
  d2 = (ulong)n_stream;
  dist = (float32 ***)
         __ckd_calloc_3d__(d1,d2,d3,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                           ,0x3bb);
  if (d1 != 0) {
    uVar3 = 0;
    do {
      if (n_stream != 0) {
        uVar4 = 0;
        do {
          if (n_density != 0) {
            pfVar1 = node->mixw_occ[uVar3][uVar4];
            pfVar2 = dist[uVar3][uVar4];
            uVar5 = 0;
            do {
              pfVar2[uVar5] = pfVar1[uVar5];
              uVar5 = uVar5 + 1;
            } while (d3 != uVar5);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != d2);
      }
      if (n_density == 0) {
        dVar8 = 0.0;
      }
      else {
        dVar8 = 0.0;
        uVar4 = 0;
        do {
          dVar8 = dVar8 + (double)(float)(*dist[uVar3])[uVar4];
          uVar4 = uVar4 + 1;
        } while (d3 != uVar4);
      }
      if (n_stream != 0) {
        uVar4 = 0;
        do {
          if (n_density != 0) {
            pfVar1 = dist[uVar3][uVar4];
            uVar5 = 0;
            do {
              fVar7 = (float)((double)(float)pfVar1[uVar5] * (1.0 / dVar8));
              fVar9 = mwfloor;
              if ((float)mwfloor <= fVar7) {
                fVar9 = (float32)fVar7;
              }
              pfVar1[uVar5] = fVar9;
              uVar5 = uVar5 + 1;
            } while (d3 != uVar5);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != d2);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != d1);
  }
  fVar6 = best_q(mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,stwt,dfeat,n_dfeat,all_q,
                 n_all_q,pset,node->id,node->n_id,dist,node->wt_ent,(quest_t **)&node->q);
  node->wt_ent_dec = fVar6;
  ckd_free_3d(dist);
  return node->wt_ent_dec;
}

Assistant:

float64
set_best_quest(dtree_node_t *node,
	       float32 ****mixw,
               float32 ****means,
               float32 ****vars,
               uint32  *veclen,
	       uint32 n_model,
	       uint32 n_state,
	       uint32 n_stream,
	       uint32 n_density,
	       float32 *stwt,

	       quest_t *all_q,
	       uint32 n_all_q,
	       pset_t *pset,

	       uint32 **dfeat,
	       uint32 n_dfeat,

	       float32 mwfloor)
{
    float32 ***dist;
    float64 norm;
    uint32 s, j, k;
    
    dist = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));

    /* Convert occ. counts to probabilities. norm now has total occ. count */
    for (s = 0; s < n_state; s++) {
	for (j = 0; j < n_stream; j++) {
	    for (k = 0; k < n_density; k++) {
		dist[s][j][k] = node->mixw_occ[s][j][k];
	    }
	}
	for (k = 0, norm = 0; k < n_density; k++) {
	    norm += dist[s][0][k];
	}
	norm = 1.0 / norm;
	for (j = 0; j < n_stream; j++) {
	    for (k = 0; k < n_density; k++) {
		dist[s][j][k] *= norm;
		if (dist[s][j][k] < mwfloor) {
		    dist[s][j][k] = mwfloor;
		}
	    }
	}
    }

    node->wt_ent_dec = best_q(mixw, means, vars, veclen,
                              n_model, n_state, n_stream, n_density,
			      stwt,
			      dfeat, n_dfeat,
			      all_q, n_all_q,
			      pset,
			      node->id, node->n_id,
			      dist, node->wt_ent,
			      (quest_t **)&node->q);

    ckd_free_3d((void ***)dist);

    return node->wt_ent_dec;
}